

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherCWrapper.cpp
# Opt level: O3

char * efsw_getlasterror(void)

{
  undefined1 *local_28 [2];
  undefined1 local_18 [16];
  
  if (efsw_getlasterror::log_str_abi_cxx11_ == '\0') {
    efsw_getlasterror_cold_1();
  }
  efsw::Errors::Log::getLastErrorLog_abi_cxx11_();
  std::__cxx11::string::operator=
            ((string *)&efsw_getlasterror::log_str_abi_cxx11_,(string *)local_28);
  if (local_28[0] != local_18) {
    operator_delete(local_28[0]);
  }
  return efsw_getlasterror::log_str_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

const char* efsw_getlasterror() {
	static std::string log_str;
	log_str = efsw::Errors::Log::getLastErrorLog();
	return log_str.c_str();
}